

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvode.c
# Opt level: O2

void cvRescale(CVodeMem cv_mem)

{
  uint nvec;
  ulong uVar1;
  ulong uVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = cv_mem->cv_eta;
  cv_mem->cv_cvals[0] = dVar3;
  nvec = cv_mem->cv_q;
  uVar1 = 0;
  uVar2 = 0;
  dVar4 = dVar3;
  if (0 < (int)nvec) {
    uVar2 = (ulong)nvec;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    cv_mem->cv_cvals[uVar1 + 1] = dVar4 * dVar3;
    dVar4 = dVar4 * dVar3;
  }
  N_VScaleVectorArray(nvec,cv_mem->cv_cvals,cv_mem->cv_zn + 1,cv_mem->cv_zn + 1);
  dVar3 = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_h = dVar3;
  cv_mem->cv_next_h = dVar3;
  cv_mem->cv_hscale = dVar3;
  cv_mem->cv_nscon = 0;
  return;
}

Assistant:

void cvRescale(CVodeMem cv_mem)
{
  int j;

  /* compute scaling factors */
  cv_mem->cv_cvals[0] = cv_mem->cv_eta;
  for (j=1; j <= cv_mem->cv_q; j++)
    cv_mem->cv_cvals[j] = cv_mem->cv_eta * cv_mem->cv_cvals[j-1];

  (void) N_VScaleVectorArray(cv_mem->cv_q, cv_mem->cv_cvals,
                             cv_mem->cv_zn+1, cv_mem->cv_zn+1);

  cv_mem->cv_h = cv_mem->cv_hscale * cv_mem->cv_eta;
  cv_mem->cv_next_h = cv_mem->cv_h;
  cv_mem->cv_hscale = cv_mem->cv_h;
  cv_mem->cv_nscon = 0;
}